

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O2

int __thiscall
packed_gamma_file3<unsigned_int,_6UL>::close(packed_gamma_file3<unsigned_int,_6UL> *this,int __fd)

{
  pointer puVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint local_c;
  
  puVar1 = (this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->buffer).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  if (uVar4 % 6 != 0) {
    uVar3 = uVar4 - uVar4 % 6;
    local_c = 0;
    while( true ) {
      if (uVar4 <= uVar3) break;
      uVar6 = (ulong)puVar1[uVar3];
      uVar5 = (uint)(byte)(0x40 - (char)LZCOUNT(uVar6));
      if (uVar6 == 0) {
        uVar5 = 1;
      }
      if ((byte)uVar5 < (byte)local_c) {
        uVar5 = local_c;
      }
      local_c = uVar5;
      uVar3 = uVar3 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->blocks_bitsizes,&local_c);
  }
  flush_to_file(this);
  iVar2 = std::ofstream::close();
  return iVar2;
}

Assistant:

void close(){

		assert(write);

		//in this case we did not compute last bitsize
		if(buffer.size()%block_size != 0){

			uint8_t max_bitsize = 0;

			for(uint64_t i=(buffer.size()/block_size)*block_size;i<buffer.size();++i){

				max_bitsize = std::max(max_bitsize,wd(buffer[i]));

			}

			blocks_bitsizes.push_back(max_bitsize);

		}

		flush_to_file();

		out.close();

	}